

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

short __thiscall QByteArray::toShort(QByteArray *this,bool *ok,int base)

{
  short sVar1;
  undefined4 in_EDX;
  bool *in_RSI;
  int in_stack_0000002c;
  undefined1 in_stack_00000030 [16];
  undefined4 in_stack_ffffffffffffffe8;
  
  qToByteArrayViewIgnoringNull<QByteArray,_true>
            ((QByteArray *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  sVar1 = QtPrivate::toIntegral<short,QByteArrayView,void>
                    ((QByteArrayView)in_stack_00000030,in_RSI,in_stack_0000002c);
  return sVar1;
}

Assistant:

short QByteArray::toShort(bool *ok, int base) const
{
    return QtPrivate::toIntegral<short>(qToByteArrayViewIgnoringNull(*this), ok, base);
}